

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  ~NamePattern(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}